

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::generate_consts
          (t_dart_generator *this,vector<t_const_*,_std::allocator<t_const_*>_> *consts)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  reference pptVar4;
  t_type *type;
  t_const_value *value;
  int __oflag;
  int __fd;
  string local_410;
  string local_3f0;
  __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_> local_3d0;
  t_const **local_3c8;
  __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_> local_3c0;
  iterator c_iter;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  undefined1 local_2a8 [8];
  ofstream_with_content_based_conditional_update f_consts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  string f_consts_name;
  undefined1 local_88 [8];
  string file_name;
  string local_58;
  undefined1 local_38 [8];
  string class_name;
  vector<t_const_*,_std::allocator<t_const_*>_> *consts_local;
  t_dart_generator *this_local;
  
  class_name.field_2._8_8_ = consts;
  bVar1 = std::vector<t_const_*,_std::allocator<t_const_*>_>::empty(consts);
  if (!bVar1) {
    std::__cxx11::string::string
              ((string *)&local_58,
               (string *)&(this->super_t_oop_generator).super_t_generator.program_name_);
    get_constants_class_name((string *)local_38,this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string
              ((string *)(f_consts_name.field_2._M_local_buf + 8),(string *)local_38);
    get_file_name((string *)local_88,this,(string *)((long)&f_consts_name.field_2 + 8));
    std::__cxx11::string::~string((string *)(f_consts_name.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &f_consts.field_0x198,&this->src_dir_,"/");
    std::operator+(&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &f_consts.field_0x198,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   &local_e8,".dart");
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&f_consts.field_0x198);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    template_ofstream_with_content_based_conditional_update
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_2a8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,pcVar2,&local_2c9);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_2a8,(char *)local_2c8,__oflag);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_2f0);
    poVar3 = std::operator<<((ostream *)local_2a8,local_2f0);
    std::__cxx11::string::string((string *)&local_330,(string *)local_88);
    dart_library(&local_310,this,&local_330);
    poVar3 = std::operator<<(poVar3,(string *)&local_310);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string(local_2f0);
    dart_thrift_imports_abi_cxx11_(&local_350,this);
    poVar3 = std::operator<<((ostream *)local_2a8,(string *)&local_350);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::string((string *)&local_370,(string *)local_88);
    std::__cxx11::string::string((string *)&local_390,(string *)local_38);
    export_class_to_library(this,&local_370,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_370);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_2a8);
    poVar3 = std::operator<<(poVar3,"class ");
    std::operator<<(poVar3,(string *)local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3b0," ",(allocator *)((long)&c_iter._M_current + 7));
    scope_up(this,(ostream *)local_2a8,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&c_iter._M_current + 7));
    __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
    __normal_iterator(&local_3c0);
    local_3c8 = (t_const **)std::vector<t_const_*,_std::allocator<t_const_*>_>::begin(consts);
    local_3c0._M_current = local_3c8;
    while( true ) {
      local_3d0._M_current =
           (t_const **)std::vector<t_const_*,_std::allocator<t_const_*>_>::end(consts);
      bVar1 = __gnu_cxx::operator!=(&local_3c0,&local_3d0);
      if (!bVar1) break;
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&local_3c0);
      t_const::get_name_abi_cxx11_(&local_3f0,*pptVar4);
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&local_3c0);
      type = t_const::get_type(*pptVar4);
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&local_3c0);
      value = t_const::get_value(*pptVar4);
      print_const_value(this,(ostream *)local_2a8,&local_3f0,type,value,false,false);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::operator<<((ostream *)local_2a8,(string *)&::endl_abi_cxx11_);
      __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
      ::operator++(&local_3c0);
    }
    std::__cxx11::string::string((string *)&local_410,(string *)&::endl_abi_cxx11_);
    poVar3 = (ostream *)local_2a8;
    scope_down(this,poVar3,&local_410);
    __fd = (int)poVar3;
    std::__cxx11::string::~string((string *)&local_410);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_2a8,__fd);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    ~template_ofstream_with_content_based_conditional_update
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_2a8);
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void t_dart_generator::generate_consts(std::vector<t_const*> consts) {
  if (consts.empty()) {
    return;
  }

  string class_name = get_constants_class_name(program_name_);
  string file_name = get_file_name(class_name);

  string f_consts_name = src_dir_ + "/" + file_name + ".dart";
  ofstream_with_content_based_conditional_update f_consts;
  f_consts.open(f_consts_name.c_str());

  // Print header
  f_consts << autogen_comment() << dart_library(file_name) << endl;
  f_consts << dart_thrift_imports() << endl;

  export_class_to_library(file_name, class_name);
  indent(f_consts) << "class " << class_name;
  scope_up(f_consts);

  vector<t_const*>::iterator c_iter;
  for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
    print_const_value(f_consts,
                      (*c_iter)->get_name(),
                      (*c_iter)->get_type(),
                      (*c_iter)->get_value(),
                      false);
    f_consts << endl;
  }

  scope_down(f_consts);

  f_consts.close();
}